

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O1

int zlib_huflookup(unsigned_long *bitsp,int *nbitsp,zlib_table *tab)

{
  byte bVar1;
  short sVar2;
  zlib_tableentry *pzVar3;
  int in_EAX;
  unsigned_long uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar4 = *bitsp;
  iVar5 = *nbitsp;
  do {
    pzVar3 = tab->table;
    uVar7 = (long)tab->mask & uVar4;
    bVar1 = pzVar3[uVar7].nbits;
    iVar6 = iVar5 - (uint)bVar1;
    if (iVar5 < (int)(uint)bVar1) {
      bVar8 = false;
      in_EAX = -1;
    }
    else {
      uVar4 = uVar4 >> (bVar1 & 0x3f);
      sVar2 = pzVar3[uVar7].code;
      iVar5 = iVar6;
      if (sVar2 == -1) {
        tab = pzVar3[uVar7].nexttable;
        bVar8 = tab != (zlib_table *)0x0;
        if (!bVar8) {
          in_EAX = -2;
        }
      }
      else {
        *bitsp = uVar4;
        *nbitsp = iVar6;
        bVar8 = false;
        in_EAX = (int)sVar2;
      }
    }
  } while (bVar8);
  return in_EAX;
}

Assistant:

static int zlib_huflookup(unsigned long *bitsp, int *nbitsp,
                   struct zlib_table *tab)
{
    unsigned long bits = *bitsp;
    int nbits = *nbitsp;
    while (1) {
        struct zlib_tableentry *ent;
        ent = &tab->table[bits & tab->mask];
        if (ent->nbits > nbits)
            return -1;                 /* not enough data */
        bits >>= ent->nbits;
        nbits -= ent->nbits;
        if (ent->code == -1)
            tab = ent->nexttable;
        else {
            *bitsp = bits;
            *nbitsp = nbits;
            return ent->code;
        }

        if (!tab) {
            /*
             * There was a missing entry in the table, presumably
             * due to an invalid Huffman table description, and the
             * subsequent data has attempted to use the missing
             * entry. Return a decoding failure.
             */
            return -2;
        }
    }
}